

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_init_file(ma_dr_mp3 *pMP3,char *pFilePath,
                             ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_dr_mp3_read_proc in_RDX;
  ma_dr_mp3 *in_RSI;
  FILE *pFile;
  ma_bool32 result;
  ma_allocation_callbacks *in_stack_ffffffffffffffc8;
  FILE *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  mVar1 = ma_fopen((FILE **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  if (mVar1 == MA_SUCCESS) {
    local_4 = ma_dr_mp3_init(in_RSI,in_RDX,
                             (ma_dr_mp3_seek_proc)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (local_4 == 1) {
      local_4 = 1;
    }
    else {
      fclose(in_stack_ffffffffffffffd0);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_init_file(ma_dr_mp3* pMP3, const char* pFilePath, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 result;
    FILE* pFile;
    if (ma_fopen(&pFile, pFilePath, "rb") != MA_SUCCESS) {
        return MA_FALSE;
    }
    result = ma_dr_mp3_init(pMP3, ma_dr_mp3__on_read_stdio, ma_dr_mp3__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    return MA_TRUE;
}